

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O3

void __thiscall CTcCodeStream::reset(CTcCodeStream *this)

{
  CTcDataStream::reset(&this->super_CTcDataStream);
  this->line_cnt_ = 0;
  this->active_lbl_ = (CTcCodeLabel *)0x0;
  this->free_lbl_ = (CTcCodeLabel *)0x0;
  this->free_fixup_ = (CTcLabelFixup *)0x0;
  this->symtab_ = (CTcPrsSymtab *)0x0;
  this->goto_symtab_ = (CTcPrsSymtab *)0x0;
  this->cur_switch_ = (CTPNStmSwitch *)0x0;
  this->enclosing_ = (CTPNStmEnclosing *)0x0;
  this->code_body_ = (CTPNCodeBody *)0x0;
  this->frame_head_ = (CTcPrsSymtab *)0x0;
  this->frame_tail_ = (CTcPrsSymtab *)0x0;
  this->frame_cnt_ = 0;
  this->cur_frame_ = (CTcPrsSymtab *)0x0;
  this->field_0xa8 = this->field_0xa8 & 0xfe;
  return;
}

Assistant:

void CTcCodeStream::reset()
{
    /* inherit default */
    CTcDataStream::reset();

    /* clear the line records */
    clear_line_recs();

    /* 
     *   forget all of the labels and fixups - they're allocated from the
     *   allocator pool, which we've completely reset now 
     */
    free_lbl_ = active_lbl_ = 0;
    free_fixup_ = 0;

    /* forget all of the symbol tables */
    symtab_ = 0;
    goto_symtab_ = 0;

    /* forget the frame list */
    frame_head_ = frame_tail_ = 0;
    cur_frame_ = 0;
    frame_cnt_ = 0;

    /* forget all of the statement settings */
    cur_switch_ = 0;
    enclosing_ = 0;
    code_body_ = 0;

    /* presume 'self' is not available */
    self_available_ = FALSE;
}